

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-foreach.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Options *out;
  Options *__s;
  Options *help_00;
  char **in_stack_00000080;
  int in_stack_0000008c;
  Options *in_stack_00000090;
  Options ops;
  string log_level;
  bool help;
  Session session;
  communicator world;
  environment env;
  undefined4 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  allocator<char> *var;
  allocator<char> *in_stack_fffffffffffffbf0;
  string *l;
  char *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Options *ops_00;
  string *help_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_00;
  undefined4 in_stack_fffffffffffffc30;
  string local_3c8 [7];
  char in_stack_fffffffffffffc3f;
  allocator<char> local_391;
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [47];
  allocator<char> local_339;
  string local_338 [39];
  undefined1 local_311 [48];
  undefined1 local_2e1 [40];
  undefined1 local_2b9 [48];
  allocator<char> local_289;
  string local_288 [39];
  undefined1 local_261 [33];
  Session *in_stack_fffffffffffffdc0;
  undefined1 local_1f9 [40];
  byte local_1d1;
  communicator local_30;
  int local_4;
  
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbbc,(char **)0x14ba2d);
  diy::mpi::communicator::communicator
            ((communicator *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  Catch::Session::Session(in_stack_fffffffffffffdc0);
  DoubleForeachFixture::nblocks = diy::mpi::communicator::size(&local_30);
  var_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f9;
  iVar2 = DoubleForeachFixture::nblocks;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator((allocator<char> *)local_1f9);
  opts::Options::Options((Options *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  help_01 = (string *)local_261;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  opts::Option<int>(in_stack_fffffffffffffc3f,(string *)CONCAT44(iVar2,in_stack_fffffffffffffc30),
                    (int *)var_00,help_01);
  out = opts::Options::operator>>
                  ((Options *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  ops_00 = (Options *)local_2b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  opts::Option<unsigned_int>
            (in_stack_fffffffffffffc3f,(string *)CONCAT44(iVar2,in_stack_fffffffffffffc30),
             (uint *)var_00,help_01);
  __s = opts::Options::operator>>
                  ((Options *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  l = (string *)local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)l);
  var = &local_339;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)l);
  opts::Option<std::__cxx11::string>
            (in_stack_fffffffffffffc3f,(string *)CONCAT44(iVar2,in_stack_fffffffffffffc30),var_00,
             help_01);
  help_00 = opts::Options::operator>>
                      ((Options *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                       (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                       CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)l);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)l);
  opts::Option<bool>((char)((ulong)__s >> 0x38),l,(bool *)var,(string *)help_00);
  opts::Options::operator>>
            ((Options *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)(local_311 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_311);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  std::__cxx11::string::~string((string *)(local_2e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2e1);
  std::__cxx11::string::~string((string *)(local_2b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2b9);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)(local_261 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_261);
  bVar1 = opts::Options::parse(in_stack_00000090,in_stack_0000008c,in_stack_00000080);
  if (((bVar1) && ((local_1d1 & 1) == 0)) ||
     (iVar2 = diy::mpi::communicator::rank(&local_30), iVar2 != 0)) {
    std::__cxx11::string::string(local_3c8,(string *)(local_1f9 + 1));
    diy::create_logger((string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    Catch::clara::std::shared_ptr<diy::spd::logger>::~shared_ptr
              ((shared_ptr<diy::spd::logger> *)0x14c223);
    std::__cxx11::string::~string(local_3c8);
    in_stack_fffffffffffffbc4 =
         Catch::Session::run((Session *)
                             CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    local_4 = in_stack_fffffffffffffbc4;
  }
  else {
    opts::operator<<((ostream *)out,ops_00);
    local_4 = 1;
  }
  opts::Options::~Options((Options *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  std::__cxx11::string::~string((string *)(local_1f9 + 1));
  Catch::Session::~Session((Session *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0))
  ;
  diy::mpi::communicator::~communicator((communicator *)0x14c2b2);
  diy::mpi::environment::~environment((environment *)0x14c2bf);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment env(argc, argv);
  diy::mpi::communicator world;

  Catch::Session session;

  DoubleForeachFixture::nblocks = world.size();
  bool help;

  std::string log_level   = "info";

  // get command line arguments
  using namespace opts;
  Options ops;
  ops >> Option('b', "blocks", DoubleForeachFixture::nblocks,   "number of blocks")
      >> Option('i', "iter",   DoubleForeachFixture::iter,      "number of iterations")
      >> Option('l', "log",    log_level,                       "log level")
      >> Option('h', "help",   help,                            "show help");
  if (!ops.parse(argc,argv) || help)
  {
    if (world.rank() == 0)
    {
      std::cout << ops;
      return 1;
    }
  }

  diy::create_logger(log_level);

  return session.run();
}